

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

void __thiscall Arbitraryshort::~Arbitraryshort(Arbitraryshort *this)

{
  testinator::Test::~Test(&this->super_Test);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(short, Arbitrary)
{
  testinator::Arbitrary<short> a;
  short v = a.generate(0,0);
  a.shrink(v);
  return true;
}